

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>>,Eigen::Matrix<float,3,1,0,3,1>,float,float>
               (Transpose<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_> *dst,
               Matrix<float,_3,_1,_0,_3,_1> *src,assign_op<float,_float> *param_3)

{
  Index IVar1;
  Index ncols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<float,_float> *param_2_local;
  Matrix<float,_3,_1,_0,_3,_1> *src_local;
  Transpose<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_> *dst_local;
  
  IVar1 = PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::rows
                    (&src->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>);
  ncols = PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::cols
                    (&src->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>);
  IVar2 = Transpose<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>::rows(dst);
  if (IVar2 == IVar1) {
    IVar2 = Transpose<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>::cols(dst);
    if (IVar2 == ncols) goto LAB_0021d52d;
  }
  Transpose<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>::resize
            (dst,IVar1,ncols);
LAB_0021d52d:
  IVar2 = Transpose<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>::rows(dst);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = Transpose<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>::cols(dst);
    bVar3 = IVar1 == ncols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Transpose<Eigen::Block<Eigen::Matrix<float, 3, 3>, 1, 3>>, SrcXprType = Eigen::Matrix<float, 3, 1>, T1 = float, T2 = float]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}